

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demand_queue.hpp
# Opt level: O1

demand_unique_ptr_t __thiscall
so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t::pop(demand_queue_t *this)

{
  long *plVar1;
  lock_t lVar2;
  long lVar3;
  bool bVar4;
  undefined8 *puVar5;
  _Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false> _Var6;
  undefined8 *in_RSI;
  undefined8 *puVar7;
  
  plVar1 = (long *)*in_RSI;
  (**(code **)(*plVar1 + 0x10))(plVar1);
  while ((*(char *)(in_RSI + 1) == '\0' && (in_RSI[2] == 0))) {
    (**(code **)(*plVar1 + 0x20))(plVar1);
  }
  if (*(char *)(in_RSI + 1) == '\0') {
    puVar5 = (undefined8 *)in_RSI[0x43];
    _Var6._M_head_impl = (lock_t *)puVar5[2];
    if (_Var6._M_head_impl == (lock_t *)0x0) {
      do {
        puVar5[5] = 0;
        bVar4 = puVar5 <= in_RSI + 3;
        puVar5 = puVar5 + -8;
        if (bVar4) {
          puVar5 = in_RSI + 0x3b;
        }
        _Var6._M_head_impl = (lock_t *)puVar5[2];
      } while (_Var6._M_head_impl == (lock_t *)0x0);
      in_RSI[0x43] = puVar5;
    }
    (this->m_lock)._M_t.
    super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
    .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl =
         _Var6._M_head_impl;
    lVar2._vptr_lock_t = _Var6._M_head_impl[6]._vptr_lock_t;
    puVar5[2] = lVar2._vptr_lock_t;
    if (lVar2._vptr_lock_t == (_func_int **)0x0) {
      puVar5[3] = 0;
    }
    _Var6._M_head_impl[6]._vptr_lock_t = (_func_int **)0x0;
    LOCK();
    puVar5[7] = puVar5[7] + -1;
    UNLOCK();
    in_RSI[2] = in_RSI[2] + -1;
    puVar5 = (undefined8 *)in_RSI[0x43];
    lVar3 = puVar5[5];
    puVar5[5] = lVar3 + 1U;
    if ((ulong)puVar5[4] <= lVar3 + 1U) {
      puVar5[5] = 0;
      puVar7 = puVar5 + -8;
      if (puVar5 <= in_RSI + 3) {
        puVar7 = in_RSI + 0x3b;
      }
      in_RSI[0x43] = puVar7;
    }
    (**(code **)(*plVar1 + 0x18))(plVar1);
    return (__uniq_ptr_data<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>,_true,_true>
            )(__uniq_ptr_data<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>,_true,_true>
              )this;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = &PTR__exception_0028edd0;
  __cxa_throw(puVar5,&shutdown_ex_t::typeinfo,std::exception::~exception);
}

Assistant:

demand_unique_ptr_t
		pop()
			{
				queue_traits::unique_lock_t lock{ *m_lock };

				while( !m_shutdown && !m_total_demands_count )
					lock.wait_for_notify();

				if( m_shutdown )
					throw shutdown_ex_t();

				// Note: this loop should not be infinitife because
				// m_total_demands_count is not a zero. It means that
				// there is at least one demand somewhere.
				while( !m_current_priority->m_head )
					switch_to_lower_priority();

				// There is a demand to extract.
				demand_unique_ptr_t result{ m_current_priority->m_head };

				m_current_priority->m_head = result->m_next;
				if( !m_current_priority->m_head )
					m_current_priority->m_tail = nullptr;

				result->m_next = nullptr;

				--(m_current_priority->m_demands_count);
				--m_total_demands_count;

				++(m_current_priority->m_demands_processed);

				if( m_current_priority->m_demands_processed >=
						m_current_priority->m_quote )
					{
						// Processing of this priority on the current
						// iteration is finished.
						switch_to_lower_priority();
					}

				return result;
			}